

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_optimizer.hpp
# Opt level: O2

unique_ptr<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>_>
 __thiscall
chaiscript::optimizer::If::optimize<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>>
          (If *this,
          AST_Node_Impl_Ptr<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_> *node)

{
  long lVar1;
  bool bVar2;
  undefined8 *puVar3;
  long lVar4;
  long *in_RDX;
  Boxed_Value condition;
  __shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  lVar4 = *in_RDX;
  if (((*(int *)(lVar4 + 8) == 0xe) &&
      (8 < (ulong)(*(long *)(lVar4 + 0x58) - (long)*(long **)(lVar4 + 0x50)))) &&
     (lVar1 = **(long **)(lVar4 + 0x50), *(int *)(lVar1 + 8) == 0x2b)) {
    std::__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_28,
               (__shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2> *)
               (lVar1 + 0x68));
    bVar2 = Type_Info::bare_equal_type_info
                      (&(local_28._M_ptr)->m_type_info,(type_info *)&bool::typeinfo);
    if (bVar2) {
      bVar2 = boxed_cast<bool>((Boxed_Value *)&local_28,(Type_Conversions_State *)0x0);
      lVar4 = *in_RDX;
      if (bVar2) {
        puVar3 = (undefined8 *)(*(long *)(lVar4 + 0x50) + 8);
LAB_003c4294:
        *(undefined8 *)this = *puVar3;
        *puVar3 = 0;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
        return (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
                )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
                  )this;
      }
      if (*(long *)(lVar4 + 0x58) - *(long *)(lVar4 + 0x50) == 0x18) {
        puVar3 = (undefined8 *)(*(long *)(lVar4 + 0x50) + 0x10);
        goto LAB_003c4294;
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    lVar4 = *in_RDX;
  }
  *(long *)this = lVar4;
  *in_RDX = 0;
  return (__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
          )(__uniq_ptr_data<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>,_std::default_delete<chaiscript::eval::AST_Node_Impl<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>_>,_true,_true>
            )this;
}

Assistant:

auto optimize(eval::AST_Node_Impl_Ptr<T> node) {
        if ((node->identifier == AST_Node_Type::If) && node->children.size() >= 2 && node->children[0]->identifier == AST_Node_Type::Constant) {
          const auto condition = dynamic_cast<eval::Constant_AST_Node<T> *>(node->children[0].get())->m_value;
          if (condition.get_type_info().bare_equal_type_info(typeid(bool))) {
            if (boxed_cast<bool>(condition)) {
              return std::move(node->children[1]);
            } else if (node->children.size() == 3) {
              return std::move(node->children[2]);
            }
          }
        }

        return node;
      }